

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

AssertionResult
testing::internal::CmpHelperEQ<bool,bool>
          (char *expected_expression,char *actual_expression,bool *expected,bool *actual)

{
  string *in_RCX;
  string *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  char *in_RSI;
  bool *in_RDI;
  byte *in_R8;
  AssertionResult AVar2;
  bool *value;
  string local_68 [32];
  string local_48 [39];
  undefined1 ignoring_case;
  string *expected_value;
  bool *expected_expression_00;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar1
  ;
  
  if (((byte)in_RCX->_M_dataplus & 1) == (*in_R8 & 1)) {
    AVar2 = AssertionSuccess();
    sVar1 = AVar2.message_.ptr_;
  }
  else {
    value = in_RDI;
    unique0x10000110 = in_R8;
    expected_value = in_RDX;
    expected_expression_00 = in_RDI;
    FormatForComparisonFailureMessage<bool,bool>(in_RDI,(bool *)in_RDX);
    ignoring_case = (undefined1)((ulong)stack0xffffffffffffffd8 >> 0x38);
    FormatForComparisonFailureMessage<bool,bool>(value,(bool *)in_RDX);
    EqFailure(expected_expression_00,in_RSI,expected_value,in_RCX,(bool)ignoring_case);
    std::__cxx11::string::~string(local_68);
    std::__cxx11::string::~string(local_48);
    sVar1.ptr_ = extraout_RDX;
  }
  AVar2.message_.ptr_ = sVar1.ptr_;
  AVar2._0_8_ = in_RDI;
  return AVar2;
}

Assistant:

AssertionResult CmpHelperEQ(const char* expected_expression,
                            const char* actual_expression,
                            const T1& expected,
                            const T2& actual) {
#ifdef _MSC_VER
# pragma warning(push)          // Saves the current warning state.
# pragma warning(disable:4389)  // Temporarily disables warning on
                                // signed/unsigned mismatch.
#endif

  if (expected == actual) {
    return AssertionSuccess();
  }

#ifdef _MSC_VER
# pragma warning(pop)          // Restores the warning state.
#endif

  return EqFailure(expected_expression,
                   actual_expression,
                   FormatForComparisonFailureMessage(expected, actual),
                   FormatForComparisonFailureMessage(actual, expected),
                   false);
}